

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_>::
clear(BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *this)

{
  long lVar1;
  void *ptr;
  
  lVar1 = *(long *)(this + 0x38);
  ptr = *(void **)(this + 0x40);
  if (ptr != (void *)0x0) {
    if ((ulong)(lVar1 << 5) < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,lVar1 << 5,(bool)this[0x28]);
    }
  }
  if (lVar1 != 0) {
    (**(code **)**(undefined8 **)(this + 0x20))(*(undefined8 **)(this + 0x20),lVar1 * -0x20,1);
  }
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  return;
}

Assistant:

void clear() {
        prims.clear();
      }